

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_send(quicly_conn_t *conn,quicly_address_t *dest,quicly_address_t *src,iovec *datagrams,
               size_t *num_datagrams,void *buf,size_t bufsize)

{
  uint64_t *puVar1;
  uint32_t *puVar2;
  ushort uVar3;
  long lVar4;
  st_quicly_application_space_t *space;
  _func_void_void_ptr_char_ptr_varargs *p_Var5;
  st_quicly_now_t *psVar6;
  st_quicly_generate_resumption_token_t *psVar7;
  st_quicly_stream_scheduler_t *psVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  byte bVar13;
  quicly_state_t qVar14;
  int iVar15;
  int64_t iVar16;
  quicly_sent_packet_t *pqVar17;
  long lVar18;
  uint64_t uVar19;
  ulong uVar20;
  st_quicly_pn_space_t *psVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  quicly_stream_t *stream;
  ulong uVar24;
  en_quicly_send_packet_mode_t mode;
  size_t sVar25;
  uint ack_only;
  ulong uVar26;
  char *reason_phrase;
  st_quicly_pending_path_challenge_t *__ptr;
  size_t sVar27;
  size_t sVar28;
  st_quicly_handshake_space_t *psVar29;
  uint uVar30;
  _st_quicly_conn_public_t *c;
  size_t *psVar31;
  uint64_t uVar32;
  ulong uStack_3f0;
  size_t local_3c8;
  quicly_send_context_t local_3b8;
  quicly_local_cid_set_t *local_348;
  quicly_address_t *local_340;
  quicly_sent_t *local_338;
  ptls_buffer_t tokenbuf;
  quicly_sentmap_iter_t iter;
  uint8_t tokenbuf_small [128];
  
  local_3b8.current.cipher = (st_quicly_cipher_context_t *)0x0;
  local_3b8.current.first_byte = 0xff;
  local_3b8.target._16_8_ = 0;
  local_3b8.target.cipher = (st_quicly_cipher_context_t *)0x0;
  local_3b8.target.first_byte_at = (uint8_t *)0x0;
  uVar26 = *num_datagrams;
  local_3b8.num_datagrams = 0;
  local_3b8.payload_buf.end = (uint8_t *)((long)buf + bufsize);
  local_3b8.send_window = 0;
  local_3b8.dst = (uint8_t *)0x0;
  local_3b8.dst_end = (uint8_t *)0x0;
  local_3b8.dst_payload_from = (uint8_t *)0x0;
  iVar15 = 0;
  local_3b8.datagrams = datagrams;
  local_3b8.max_datagrams = uVar26;
  local_3b8.payload_buf.datagram = (uint8_t *)buf;
  local_340 = dest;
  lock_now(conn,0);
  lVar18 = (conn->stash).now;
  iVar16 = quicly_get_first_timeout(conn);
  if (lVar18 < iVar16) goto LAB_001180f8;
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    init_acks_iter(conn,&iter);
    qVar14 = (conn->super).state;
    if ((qVar14 == QUICLY_STATE_DRAINING) ||
       ((conn->super).stats.num_frames_sent.transport_close +
        (conn->super).stats.num_frames_sent.application_close != 0)) {
      pqVar17 = quicly_sentmap_get(&iter);
      if (pqVar17->packet_number == 0xffffffffffffffff) {
        iVar15 = 0xff03;
        if ((conn->super).local.uni.num_streams + (conn->super).local.bidi.num_streams +
            (conn->super).remote.bidi.num_streams + (conn->super).remote.uni.num_streams != 0) {
          __assert_fail("quicly_num_streams(conn) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x1156,
                        "int quicly_send(quicly_conn_t *, quicly_address_t *, quicly_address_t *, struct iovec *, size_t *, void *, size_t)"
                       );
        }
        goto LAB_001180f8;
      }
      qVar14 = (conn->super).state;
    }
    if ((qVar14 == QUICLY_STATE_CLOSING) && ((conn->egress).send_ack_at <= (conn->stash).now)) {
      destroy_all_streams(conn,0,0);
      for (sVar27 = 0; sVar27 != 4; sVar27 = sVar27 + 1) {
        psVar21 = setup_send_space(conn,sVar27,&local_3b8);
        if (psVar21 != (st_quicly_pn_space_t *)0x0) {
          uVar32 = (uint64_t)(conn->egress).connection_close.error_code;
          uVar19 = (conn->egress).connection_close.frame_type;
          reason_phrase = (conn->egress).connection_close.reason_phrase;
          if (uVar19 == 0xffffffffffffffff) {
            bVar13 = get_epoch(local_3b8.current.first_byte);
            uVar19 = 0xffffffffffffffff;
            if ((bVar13 & 0xfd) == 0) {
              uVar32 = 0x2000c;
              uVar19 = 0;
              reason_phrase = "";
            }
          }
          puVar22 = quicly_encode_close_frame((uint8_t *)0x0,uVar32,uVar19,reason_phrase);
          iVar15 = allocate_frame(conn,&local_3b8,(size_t)puVar22);
          if (iVar15 != 0) goto LAB_001180f8;
          local_3b8.dst = quicly_encode_close_frame(local_3b8.dst,uVar32,uVar19,reason_phrase);
          puVar1 = &(conn->super).stats.num_frames_sent.transport_close +
                   (uVar19 == 0xffffffffffffffff);
          *puVar1 = *puVar1 + 1;
        }
      }
      iVar15 = commit_send_packet(conn,&local_3b8,QUICLY_COMMIT_SEND_PACKET_MODE_SMALL);
      if (iVar15 != 0) goto LAB_001180f8;
    }
    pqVar17 = quicly_sentmap_get(&iter);
    lVar18 = pqVar17->sent_at;
    iVar16 = get_sentmap_expiration_time(conn);
    lVar18 = iVar16 + lVar18;
    (conn->egress).send_ack_at = lVar18;
    lVar4 = (conn->stash).now;
    iVar15 = 0;
    if (lVar18 <= lVar4) {
      (conn->egress).send_ack_at = lVar4 + 1;
    }
    goto LAB_001180f8;
  }
  iVar16 = (conn->stash).now;
  if ((conn->idle_timeout).at <= iVar16) {
    (conn->super).state = QUICLY_STATE_DRAINING;
    destroy_all_streams(conn,0,0);
    iVar15 = 0xff03;
    goto LAB_001180f8;
  }
  bVar12 = true;
  uStack_3f0 = 0;
  uVar30 = 0;
  if (iVar16 < (conn->egress).loss.alarm_at) {
LAB_00118252:
    uVar26 = (conn->egress).max_udp_payload_size * uStack_3f0;
    uVar19 = calc_amplification_limit_allowance(conn);
    if (bVar12) {
      uVar20 = (ulong)(conn->egress).cc.cwnd;
      psVar31 = &(conn->egress).loss.sentmap.bytes_in_flight;
      uVar24 = 0;
      if (*psVar31 <= uVar20) {
        uVar24 = uVar20 - *psVar31;
      }
      if (uVar26 < uVar24) {
        uVar26 = uVar24;
      }
    }
    if (uVar26 < uVar19) {
      uVar19 = uVar26;
    }
    bVar13 = uVar19 == 0;
    if (uStack_3f0 == 0) {
      uVar30 = 0;
    }
    else if (((conn->super).local.bidi.next_stream_id & 1) == 0) {
      uVar30 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
    }
    else {
      uVar30 = 1;
    }
    ack_only = (uint)bVar13;
    local_3b8.send_window = uVar19;
    iVar15 = send_handshake_flow(conn,0,&local_3b8,ack_only,uVar30);
    if ((iVar15 != 0) ||
       (iVar15 = send_handshake_flow(conn,2,&local_3b8,ack_only,(uint)(uStack_3f0 != 0)),
       iVar15 != 0)) goto LAB_001189db;
    psVar21 = setup_send_space(conn,3,&local_3b8);
    if ((psVar21 != (st_quicly_pn_space_t *)0x0) ||
       (psVar21 = setup_send_space(conn,1,&local_3b8), psVar21 != (st_quicly_pn_space_t *)0x0)) {
      space = conn->application;
      if ((((space->one_rtt_writable == 0) || ((conn->stash).now < (conn->egress).send_ack_at)) ||
          ((space->super).unacked_count == 0)) ||
         (iVar15 = send_ack(conn,&space->super,&local_3b8), iVar15 == 0)) {
        iVar15 = should_send_datagram_frame(conn);
        if (iVar15 != 0) {
          psVar31 = &(conn->egress).datagram_frame_payloads.payloads[0].len;
          local_348 = (quicly_local_cid_set_t *)CONCAT44(local_348._4_4_,ack_only);
          for (sVar27 = 0; lVar18 = 2, sVar27 != (conn->egress).datagram_frame_payloads.count;
              sVar27 = sVar27 + 1) {
            uVar26 = *psVar31;
            if ((0x3f < uVar26) && (lVar18 = 3, 0x3fff < uVar26)) {
              lVar18 = (ulong)(0x3fffffff < uVar26) * 4 + 5;
            }
            iVar15 = _do_allocate_frame(conn,&local_3b8,lVar18 + uVar26,1);
            if (iVar15 != 0) {
              bVar13 = (byte)local_348;
              goto LAB_001189db;
            }
            if ((ulong)((long)local_3b8.dst_end - (long)local_3b8.dst) < lVar18 + uVar26) {
              *local_3b8.dst = '\0';
              local_3b8.dst = local_3b8.dst + 1;
            }
            else {
              puVar22 = ((ptls_iovec_t *)(psVar31 + -1))->base;
              uVar32 = *psVar31;
              *local_3b8.dst = '1';
              puVar23 = ptls_encode_quicint(local_3b8.dst + 1,uVar32);
              memcpy(puVar23,puVar22,uVar32);
              local_3b8.dst = puVar23 + uVar32;
            }
            psVar31 = psVar31 + 2;
          }
        }
        if (uVar19 == 0) {
          bVar13 = 1;
          goto LAB_001189ed;
        }
        if (uStack_3f0 != 0) {
          iVar15 = _do_allocate_frame(conn,&local_3b8,1,1);
          if (iVar15 != 0) goto LAB_001189d9;
          *local_3b8.dst = '\x01';
          puVar1 = &(conn->super).stats.num_frames_sent.ping;
          *puVar1 = *puVar1 + 1;
          local_3b8.dst = local_3b8.dst + 1;
        }
        if (conn->application->one_rtt_writable == 0) goto LAB_00118d5f;
        bVar13 = (conn->egress).pending_flows;
        if ((bVar13 & 0x40) != 0) {
          iVar15 = allocate_ack_eliciting_frame(conn,&local_3b8,1,&iter.p,on_ack_handshake_done);
          if (iVar15 != 0) goto LAB_001189d9;
          *local_3b8.dst = '\x1e';
          bVar13 = (conn->egress).pending_flows & 0xbf;
          (conn->egress).pending_flows = bVar13;
          puVar1 = &(conn->super).stats.num_frames_sent.handshake_done;
          *puVar1 = *puVar1 + 1;
          local_3b8.dst = local_3b8.dst + 1;
        }
        if ((bVar13 & 8) != 0) {
          stream = quicly_get_stream(conn,-4);
          if (stream == (quicly_stream_t *)0x0) {
            __assert_fail("stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x10c2,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
          }
          iVar15 = quicly_send_stream(stream,&local_3b8);
          if (iVar15 != 0) goto LAB_001189d9;
          resched_stream_data(stream);
        }
        __ptr = (conn->egress).path_challenge.head;
        if (__ptr != (st_quicly_pending_path_challenge_t *)0x0) {
          do {
            iVar15 = allocate_frame(conn,&local_3b8,9);
            if (iVar15 != 0) {
              bVar13 = 0;
              goto LAB_001189db;
            }
            local_3b8.dst =
                 quicly_encode_path_challenge_frame
                           (local_3b8.dst,(uint)__ptr->is_response,__ptr->data);
            puVar1 = &(conn->super).stats.num_frames_sent.path_challenge +
                     (__ptr->is_response != '\0');
            *puVar1 = *puVar1 + 1;
            (conn->egress).path_challenge.head = __ptr->next;
            free(__ptr);
            __ptr = (conn->egress).path_challenge.head;
          } while (__ptr != (st_quicly_pending_path_challenge_t *)0x0);
          (conn->egress).path_challenge.tail_ref = &(conn->egress).path_challenge.head;
        }
        iVar15 = send_max_streams(conn,1,&local_3b8);
        if (iVar15 != 0) goto LAB_001189d9;
        iVar15 = send_max_streams(conn,0,&local_3b8);
        bVar13 = 0;
        if (iVar15 != 0) goto LAB_001189db;
        iVar15 = should_send_max_data(conn);
        if (iVar15 != 0) {
          iVar15 = allocate_ack_eliciting_frame(conn,&local_3b8,9,&iter.p,on_ack_max_data);
          if (iVar15 != 0) goto LAB_00118560;
          uVar19 = (((conn->super).ctx)->transport_params).max_data +
                   (conn->ingress).max_data.bytes_consumed;
          *local_3b8.dst = '\x10';
          local_3b8.dst = ptls_encode_quicint(local_3b8.dst + 1,uVar19);
          quicly_maxsender_record
                    (&(conn->ingress).max_data.sender,uVar19,
                     (quicly_maxsender_sent_t *)&((iter.p)->data).packet);
          puVar1 = &(conn->super).stats.num_frames_sent.max_data;
          *puVar1 = *puVar1 + 1;
          p_Var5 = (conn->super).tracer.cb;
          if (p_Var5 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
            (*p_Var5)((conn->super).tracer.ctx,
                      "{\"type\":\"max-data-send\", \"time\":%lld, \"maximum\":%llu}\n",
                      (conn->stash).now,uVar19);
          }
        }
        if ((conn->egress).data_blocked == QUICLY_SENDER_STATE_SEND) {
          uVar19 = (conn->egress).max_data.permitted;
          iVar15 = allocate_ack_eliciting_frame(conn,&local_3b8,9,&iter.p,on_ack_data_blocked);
          if (iVar15 != 0) goto LAB_00118560;
          ((iter.p)->data).packet.packet_number = uVar19;
          *local_3b8.dst = '\x14';
          local_3b8.dst = ptls_encode_quicint(local_3b8.dst + 1,uVar19);
          (conn->egress).data_blocked = QUICLY_SENDER_STATE_UNACKED;
          puVar1 = &(conn->super).stats.num_frames_sent.data_blocked;
          *puVar1 = *puVar1 + 1;
        }
        iVar15 = send_streams_blocked(conn,1,&local_3b8);
        if ((iVar15 != 0) || (iVar15 = send_streams_blocked(conn,0,&local_3b8), iVar15 != 0))
        goto LAB_00118560;
        bVar13 = (conn->egress).pending_flows;
        if ((bVar13 & 0x20) != 0) {
          tokenbuf.base = tokenbuf_small;
          tokenbuf.off = 0;
          tokenbuf.capacity = 0x80;
          tokenbuf.is_allocated = 0;
          psVar6 = ((conn->super).ctx)->now;
          iter.count = (*psVar6->cb)(psVar6);
          iter.p = (quicly_sent_t *)0x1;
          memset(&iter.ref,0,0x248);
          psVar7 = ((conn->super).ctx)->generate_resumption_token;
          iVar15 = (*psVar7->cb)(psVar7,conn,&tokenbuf,(quicly_address_token_plaintext_t *)&iter);
          if (iVar15 == 0) {
            if (599 < tokenbuf.off) {
              __assert_fail("tokenbuf.off < QUICLY_MIN_CLIENT_INITIAL_SIZE / 2 && \"this is a ballpark figure, but tokens ought to be small\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0xecb,
                            "int send_resumption_token(quicly_conn_t *, quicly_send_context_t *)");
            }
            iVar15 = allocate_ack_eliciting_frame
                               (conn,&local_3b8,(tokenbuf.off - (tokenbuf.off < 0x40)) + 3,
                                &local_338,on_ack_new_token);
            sVar27 = tokenbuf.off;
            puVar22 = tokenbuf.base;
            if (iVar15 == 0) {
              puVar2 = &(conn->egress).new_token.num_inflight;
              *puVar2 = *puVar2 + 1;
              (local_338->data).max_streams.uni = 1;
              (local_338->data).packet.sent_at = (conn->egress).new_token.generation;
              *local_3b8.dst = '\a';
              puVar23 = ptls_encode_quicint(local_3b8.dst + 1,tokenbuf.off);
              memcpy(puVar23,puVar22,sVar27);
              local_3b8.dst = puVar23 + sVar27;
              puVar22 = &(conn->egress).pending_flows;
              *puVar22 = *puVar22 & 0xdf;
              puVar1 = &(conn->super).stats.num_frames_sent.new_token;
              *puVar1 = *puVar1 + 1;
              iVar15 = 0;
            }
          }
          ptls_buffer_dispose(&tokenbuf);
          bVar13 = 0;
          if (iVar15 != 0) goto LAB_001189db;
          bVar13 = (conn->egress).pending_flows;
        }
        if ((char)bVar13 < '\0') {
          local_348 = &(conn->super).local.cid_set;
          sVar27 = (conn->super).local.cid_set._size;
          local_3c8 = 0;
          for (puVar22 = (conn->super).local.cid_set.cids[0].stateless_reset_token;
              (iVar15 = 0, sVar28 = sVar27, sVar27 != local_3c8 &&
              (sVar28 = local_3c8,
              ((quicly_local_cid_t *)(puVar22 + -0x25))->state == QUICLY_LOCAL_CID_STATE_PENDING));
              puVar22 = puVar22 + 0x38) {
            uVar26 = *(ulong *)(puVar22 + -0x1d);
            lVar18 = 4;
            if ((0x3f < uVar26) && (lVar18 = 5, 0x3fff < uVar26)) {
              lVar18 = (ulong)(0x3fffffff < uVar26) * 4 + 7;
            }
            iVar15 = allocate_ack_eliciting_frame
                               (conn,&local_3b8,(ulong)puVar22[-1] + lVar18 + 0x10,&iter.p,
                                on_ack_new_connection_id);
            if (iVar15 != 0) break;
            uVar19 = *(uint64_t *)(puVar22 + -0x1d);
            ((iter.p)->data).packet.packet_number = uVar19;
            bVar13 = puVar22[-1];
            uVar26 = (ulong)bVar13;
            *local_3b8.dst = '\x18';
            puVar23 = ptls_encode_quicint(local_3b8.dst + 1,uVar19);
            *puVar23 = '\0';
            puVar23[1] = bVar13;
            memcpy(puVar23 + 2,(quicly_cid_t *)(puVar22 + -0x15),uVar26);
            uVar9 = *(undefined8 *)(puVar22 + 8);
            local_3b8.dst = puVar23 + uVar26 + 0x12;
            *(undefined8 *)(puVar23 + uVar26 + 2) = *(undefined8 *)puVar22;
            *(undefined8 *)(puVar23 + uVar26 + 10) = uVar9;
            puVar1 = &(conn->super).stats.num_frames_sent.new_connection_id;
            *puVar1 = *puVar1 + 1;
            local_3c8 = local_3c8 + 1;
          }
          local_3c8 = sVar28;
          quicly_local_cid_on_sent(local_348,local_3c8);
          if (iVar15 == 0) {
            sVar27 = (conn->egress).retire_cid._num_pending;
            for (sVar28 = 0; sVar25 = sVar27, iVar15 = 0, sVar27 != sVar28; sVar28 = sVar28 + 1) {
              uVar26 = (conn->egress).retire_cid.sequences[sVar28];
              sVar25 = 2;
              if ((0x3f < uVar26) && (sVar25 = 3, 0x3fff < uVar26)) {
                sVar25 = (ulong)(0x3fffffff < uVar26) * 4 + 5;
              }
              iVar15 = allocate_ack_eliciting_frame
                                 (conn,&local_3b8,sVar25,&iter.p,on_ack_retire_connection_id);
              sVar25 = sVar28;
              if (iVar15 != 0) break;
              ((iter.p)->data).packet.packet_number = uVar26;
              *local_3b8.dst = '\x19';
              local_3b8.dst = ptls_encode_quicint(local_3b8.dst + 1,uVar26);
              puVar1 = &(conn->super).stats.num_frames_sent.retire_connection_id;
              *puVar1 = *puVar1 + 1;
            }
            quicly_retire_cid_shift(&(conn->egress).retire_cid,sVar25);
            if (iVar15 == 0) {
              puVar22 = &(conn->egress).pending_flows;
              *puVar22 = *puVar22 & 0x7f;
              goto LAB_00118d5f;
            }
          }
LAB_00118560:
          bVar13 = 0;
        }
        else {
LAB_00118d5f:
          iVar15 = send_stream_control_frames(conn,&local_3b8);
          bVar13 = 0;
          if ((iVar15 == 0) &&
             (psVar8 = ((conn->super).ctx)->stream_scheduler,
             iVar15 = (*psVar8->do_send)(psVar8,conn,&local_3b8), iVar15 == 0)) {
            iVar15 = send_stream_control_frames(conn,&local_3b8);
            bVar13 = 0;
          }
        }
      }
      goto LAB_001189db;
    }
  }
  else {
    psVar29 = conn->initial;
    if (psVar29 == (st_quicly_handshake_space_t *)0x0) {
      uVar30 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
    }
    uVar3 = (conn->super).remote.transport_params.max_ack_delay;
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    if ((conn->egress).loss.loss_time != 0x7fffffffffffffff) {
      iVar15 = quicly_loss_detect_loss
                         (&(conn->egress).loss,iVar16,(uint)uVar3,uVar30,on_loss_detected);
      if (iVar15 == 0) {
        if (uVar26 == 0) goto LAB_00119080;
        uStack_3f0 = 1;
        goto LAB_00118252;
      }
      goto LAB_00118560;
    }
    bVar13 = (conn->egress).loss.pto_count;
    (conn->egress).loss.pto_count = bVar13 + 1;
    uStack_3f0 = (ulong)(bVar13 < 0x7f) + 1;
    if (uVar26 < uStack_3f0) {
LAB_00119080:
      __assert_fail("min_packets_to_send <= s->max_datagrams",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x106d,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
    }
    p_Var5 = (conn->super).tracer.cb;
    if (p_Var5 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var5)((conn->super).tracer.ctx,
                "{\"type\":\"pto\", \"time\":%lld, \"inflight\":%llu, \"cwnd\":%llu, \"pto-count\":%lld}\n"
                ,iVar16,(conn->egress).loss.sentmap.bytes_in_flight,(ulong)(conn->egress).cc.cwnd,
                (long)(char)(bVar13 + 1));
      psVar29 = conn->initial;
    }
    puVar1 = &(conn->super).stats.num_ptos;
    *puVar1 = *puVar1 + 1;
    iter.p = (quicly_sent_t *)((ulong)(conn->egress).max_udp_payload_size << (bVar13 < 0x7f));
    if ((psVar29 == (st_quicly_handshake_space_t *)0x0) ||
       (iVar15 = mark_frames_on_pto(conn,'\0',(size_t *)&iter), iVar15 == 0)) {
      if (iter.p != (quicly_sent_t *)0x0) {
        if (conn->handshake != (st_quicly_handshake_space_t *)0x0) {
          iVar15 = mark_frames_on_pto(conn,'\x02',(size_t *)&iter);
          if (iVar15 != 0) goto LAB_001189d9;
          if (iter.p == (quicly_sent_t *)0x0) goto LAB_001187aa;
        }
        iVar15 = scheduler_can_send(conn);
        if ((iVar15 == 0) && (iVar15 = mark_frames_on_pto(conn,'\x03',(size_t *)&iter), iVar15 != 0)
           ) goto LAB_001189d9;
      }
LAB_001187aa:
      bVar12 = false;
      goto LAB_00118252;
    }
LAB_001189d9:
    bVar13 = 0;
LAB_001189db:
    if ((iVar15 != 0xff02) && (iVar15 != 0)) goto LAB_001180f8;
  }
LAB_001189ed:
  if (local_3b8.target.first_byte_at != (uint8_t *)0x0) {
    if ((*local_3b8.payload_buf.datagram & 0xf0) == 0xc0) {
      mode = (en_quicly_send_packet_mode_t)(bVar13 & (byte)(conn->super).local.bidi.next_stream_id);
    }
    else {
      mode = QUICLY_COMMIT_SEND_PACKET_MODE_SMALL;
    }
    commit_send_packet(conn,&local_3b8,mode);
  }
  if ((conn->application == (st_quicly_application_space_t *)0x0) ||
     ((conn->application->super).unacked_count == 0)) {
    (conn->egress).send_ack_at = 0x7fffffffffffffff;
  }
  update_loss_alarm(conn,1);
  if (local_3b8.num_datagrams != 0) {
    update_idle_timeout(conn,0);
  }
  assert_consistency(conn,1);
  iVar15 = 0;
LAB_001180f8:
  clear_datagram_frame_payloads(conn);
  if (local_3b8.num_datagrams != 0) {
    uVar9 = *(undefined8 *)&(conn->super).remote.address;
    uVar10 = *(undefined8 *)((long)&(conn->super).remote.address + 8);
    uVar11 = *(undefined8 *)((long)&(conn->super).remote.address + 0x14);
    *(undefined8 *)((local_340->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).remote.address + 0xc);
    *(undefined8 *)((long)&(local_340->sin6).sin6_addr.__in6_u + 0xc) = uVar11;
    *(undefined8 *)local_340 = uVar9;
    *(undefined8 *)((local_340->sa).sa_data + 6) = uVar10;
    uVar9 = *(undefined8 *)&(conn->super).local.address;
    uVar10 = *(undefined8 *)((long)&(conn->super).local.address + 8);
    uVar11 = *(undefined8 *)((long)&(conn->super).local.address + 0x14);
    *(undefined8 *)((src->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).local.address + 0xc);
    *(undefined8 *)((long)&(src->sin6).sin6_addr.__in6_u + 0xc) = uVar11;
    *(undefined8 *)src = uVar9;
    *(undefined8 *)((src->sa).sa_data + 6) = uVar10;
  }
  *num_datagrams = local_3b8.num_datagrams;
  unlock_now(conn);
  return iVar15;
}

Assistant:

int quicly_send(quicly_conn_t *conn, quicly_address_t *dest, quicly_address_t *src, struct iovec *datagrams, size_t *num_datagrams,
                void *buf, size_t bufsize)
{
    quicly_send_context_t s = {{NULL, -1}, {}, datagrams, *num_datagrams, 0, {buf, (uint8_t *)buf + bufsize}};
    int ret;

    lock_now(conn, 0);

    /* bail out if there's nothing is scheduled to be sent */
    if (conn->stash.now < quicly_get_first_timeout(conn)) {
        ret = 0;
        goto Exit;
    }

    QUICLY_PROBE(SEND, conn, conn->stash.now, conn->super.state,
                 QUICLY_PROBE_HEXDUMP(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len));

    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        quicly_sentmap_iter_t iter;
        init_acks_iter(conn, &iter);
        /* check if the connection can be closed now (after 3 pto) */
        if (conn->super.state == QUICLY_STATE_DRAINING ||
            conn->super.stats.num_frames_sent.transport_close + conn->super.stats.num_frames_sent.application_close != 0) {
            if (quicly_sentmap_get(&iter)->packet_number == UINT64_MAX) {
                assert(quicly_num_streams(conn) == 0);
                ret = QUICLY_ERROR_FREE_CONNECTION;
                goto Exit;
            }
        }
        if (conn->super.state == QUICLY_STATE_CLOSING && conn->egress.send_ack_at <= conn->stash.now) {
            /* destroy all streams; doing so is delayed until the emission of CONNECTION_CLOSE frame to allow quicly_close to be
             * called from a stream handler */
            destroy_all_streams(conn, 0, 0);
            /* send CONNECTION_CLOSE in all possible epochs */
            for (size_t epoch = 0; epoch < QUICLY_NUM_EPOCHS; ++epoch) {
                if ((ret = send_connection_close(conn, epoch, &s)) != 0)
                    goto Exit;
            }
            if ((ret = commit_send_packet(conn, &s, QUICLY_COMMIT_SEND_PACKET_MODE_SMALL)) != 0)
                goto Exit;
        }
        /* wait at least 1ms */
        if ((conn->egress.send_ack_at = quicly_sentmap_get(&iter)->sent_at + get_sentmap_expiration_time(conn)) <= conn->stash.now)
            conn->egress.send_ack_at = conn->stash.now + 1;
        ret = 0;
        goto Exit;
    }

    /* emit packets */
    if ((ret = do_send(conn, &s)) != 0)
        goto Exit;

    assert_consistency(conn, 1);

Exit:
    clear_datagram_frame_payloads(conn);
    if (s.num_datagrams != 0) {
        *dest = conn->super.remote.address;
        *src = conn->super.local.address;
    }
    *num_datagrams = s.num_datagrams;
    unlock_now(conn);
    return ret;
}